

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O2

Constant * add_constant(Proc *proc,Constant *c)

{
  uint16_t uVar1;
  C_MemoryAllocator *pCVar2;
  anon_union_8_3_4e90b7ae_for_Constant_2 aVar3;
  uint16_t uVar4;
  undefined4 uVar5;
  SetEntry *pSVar6;
  Constant *key;
  
  pSVar6 = raviX_set_search(proc->constants,c);
  if (pSVar6 == (SetEntry *)0x0) {
    uVar1 = c->type;
    if (uVar1 == 0x101) {
      uVar1 = (uint16_t)*(undefined4 *)&proc->num_strconstants;
      proc->num_strconstants = uVar1 + 1;
    }
    else if (uVar1 == 0x10) {
      uVar1 = proc->num_fltconstants;
      proc->num_fltconstants = uVar1 + 1;
    }
    else {
      if (uVar1 != 8) {
        __assert_fail("c->type == RAVI_TSTRING",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                      ,0x152,"const Constant *add_constant(Proc *, const Constant *)");
      }
      uVar1 = proc->num_intconstants;
      proc->num_intconstants = uVar1 + 1;
    }
    pCVar2 = proc->linearizer->compiler_state->allocator;
    key = (Constant *)(*pCVar2->calloc)(pCVar2->arena,1,0x10);
    uVar4 = c->index;
    uVar5 = *(undefined4 *)&c->field_0x4;
    aVar3 = c->field_2;
    key->type = c->type;
    key->index = uVar4;
    *(undefined4 *)&key->field_0x4 = uVar5;
    key->field_2 = aVar3;
    key->index = uVar1;
    raviX_set_add(proc->constants,key);
  }
  else {
    key = (Constant *)pSVar6->key;
  }
  return key;
}

Assistant:

static const Constant *add_constant(Proc *proc, const Constant *c)
{
	SetEntry *entry = raviX_set_search(proc->constants, c);
	if (entry == NULL) {
		int reg = 0;
		/* Assign each type of constant a different range so that if backend
		 * doesn't need to emit the regnum for a particular type it can do so.
		 * If backend needs to emit all constants then 2 of the 3 ranges can
		 * easily adjusted.
		 */
		switch(c->type) {
		case RAVI_TNUMINT:
			reg = proc->num_intconstants++;
			break;
		case RAVI_TNUMFLT:
			reg = proc->num_fltconstants++;
			break;
		default:
			assert(c->type == RAVI_TSTRING);
			reg = proc->num_strconstants++;
			break;
		}
		C_MemoryAllocator *allocator = proc->linearizer->compiler_state->allocator;
		Constant *c1 = (Constant *) allocator->calloc(allocator->arena, 1, sizeof(Constant));
		memcpy(c1, c, sizeof(Constant));
		c1->index = reg;
		raviX_set_add(proc->constants, c1);
		return c1;
	} else {
		const Constant *c1 = (Constant *) entry->key;
		return c1;
	}
}